

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

bool __thiscall
Memory::LargeHeapBlock::GetObjectHeader
          (LargeHeapBlock *this,void *objectAddress,LargeObjectHeader **ppHeader)

{
  code *pcVar1;
  LargeObjectHeader *pLVar2;
  undefined4 *puVar3;
  bool bVar4;
  
  *ppHeader = (LargeObjectHeader *)0x0;
  pLVar2 = GetHeader(this,objectAddress);
  if (pLVar2 < (LargeObjectHeader *)(this->super_HeapBlock).address) {
    bVar4 = false;
  }
  else {
    bVar4 = (LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[pLVar2->objectIndex] ==
            pLVar2;
    if (bVar4) {
      if (this->allocCount <= pLVar2->objectIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x379,"(index < this->allocCount)","index < this->allocCount");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      *ppHeader = pLVar2;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool
LargeHeapBlock::GetObjectHeader(void* objectAddress, LargeObjectHeader** ppHeader)
{
    (*ppHeader) = nullptr;

    LargeObjectHeader * header = GetHeader(objectAddress);
    if ((char *)header < this->address)
    {
        return false;
    }

    uint index = header->objectIndex;

    if (this->HeaderList()[index] != header)
    {
        // header doesn't match, not a real object
        return false;
    }

    Assert(index < this->allocCount);
    (*ppHeader) = header;
    return true;
}